

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O0

void predict_or_learn_logistic<false>(boosting *o,single_learner *base,example *ec)

{
  float fVar1;
  learner<char,_example> *this;
  reference pvVar2;
  long in_RDX;
  size_t *extraout_RDX;
  size_t *siglen;
  size_t *extraout_RDX_00;
  uchar *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  EVP_PKEY_CTX *ctx;
  size_t in_R8;
  float fVar3;
  undefined4 extraout_XMM0_Da;
  int i;
  float eta;
  float u;
  float s;
  float final_prediction;
  label_data *ld;
  int local_34;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  
  this = (learner<char,_example> *)(in_RDX + 0x6828);
  fVar6 = 0.0;
  uVar5 = 0;
  uVar4 = *(undefined4 *)(in_RDX + 0x6870);
  ctx = in_RDI;
  fVar3 = sqrtf((float)*(int *)(in_RDI + 0x78));
  fVar3 = 4.0 / fVar3;
  siglen = extraout_RDX;
  for (local_34 = 0; local_34 < *(int *)in_RDI; local_34 = local_34 + 1) {
    LEARNER::learner<char,_example>::predict
              (this,(example *)CONCAT44(fVar6,uVar5),CONCAT44(uVar4,fVar3));
    fVar1 = *(float *)(in_RDX + 0x6850);
    ctx = in_RDI + 0x48;
    in_RSI = (uchar *)(long)local_34;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)ctx,(size_type)in_RSI);
    fVar6 = fVar1 * *pvVar2 + fVar6;
    siglen = extraout_RDX_00;
  }
  *(undefined4 *)(in_RDX + 0x6870) = uVar4;
  *(float *)(in_RDX + 0x68a8) = fVar6;
  sign(ctx,in_RSI,siglen,(uchar *)in_RDI,in_R8);
  *(undefined4 *)(in_RDX + 0x6850) = extraout_XMM0_Da;
  if ((*(float *)this != *(float *)(in_RDX + 0x6850)) ||
     (NAN(*(float *)this) || NAN(*(float *)(in_RDX + 0x6850)))) {
    *(undefined4 *)(in_RDX + 0x68b0) = *(undefined4 *)(in_RDX + 0x6870);
  }
  else {
    *(undefined4 *)(in_RDX + 0x68b0) = 0;
  }
  return;
}

Assistant:

void predict_or_learn_logistic(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0;

  float s = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;
  float eta = 4.f / sqrtf((float)o.t);

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float w = 1 / (1 + correctedExp(s));

      ec.weight = u * w;

      base.predict(ec, i);
      float z;
      z = ld.label * ec.pred.scalar;

      s += z * o.alpha[i];

      // if ld.label * ec.pred.scalar < 0, learner i made a mistake

      final_prediction += ec.pred.scalar * o.alpha[i];

      // update alpha
      o.alpha[i] += eta * z / (1 + correctedExp(s));
      if (o.alpha[i] > 2.)
        o.alpha[i] = 2;
      if (o.alpha[i] < -2.)
        o.alpha[i] = -2;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      final_prediction += ec.pred.scalar * o.alpha[i];
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}